

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall google::protobuf::io::anon_unknown_0::ResetCords::~ResetCords(ResetCords *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(BlockSizes, ReadCord) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    absl::Cord cord;
    EXPECT_TRUE(coded_input.ReadCord(&cord, strlen(kRawBytes)));
    EXPECT_EQ(absl::Cord(kRawBytes), cord);
  }

  EXPECT_EQ(strlen(kRawBytes), input.ByteCount());
}